

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

void __thiscall chrono::viper::Viper::Create(Viper *this,ViperWheelType wheel_type)

{
  reference pvVar1;
  __shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  reference this_00;
  reference this_01;
  reference this_02;
  reference this_03;
  shared_ptr<chrono::ChShaft> local_7b0;
  int local_7a0;
  int local_79c;
  int i_2;
  shared_ptr<chrono::viper::ViperUpright> local_710;
  int local_6fc;
  undefined1 local_6f8 [4];
  int i_1;
  ChVector<double> sr_rel_pos [4];
  double sr_lz;
  double sr_ly;
  double sr_lx;
  ChFrame<double> local_678;
  shared_ptr<chrono::viper::ViperUpperArm> local_5f0;
  int local_5dc;
  ChFrame<double> local_5d8;
  shared_ptr<chrono::viper::ViperLowerArm> local_550;
  int local_53c;
  undefined1 local_538 [4];
  int i;
  ChVector<double> cr_rel_pos_upper [4];
  ChVector<double> cr_rel_pos_lower [4];
  double cr_lz;
  double cr_ly;
  double cr_lx;
  ChFrame<double> local_440;
  ChQuaternion<double> local_3b8;
  ChFrame<double> local_398;
  ChVector<double> local_310;
  ChFrame<double> local_2f8;
  shared_ptr<chrono::viper::ViperWheel> local_270;
  ChVector<double> local_260;
  ChFrame<double> local_248;
  shared_ptr<chrono::viper::ViperWheel> local_1c0;
  ChVector<double> local_1b0;
  ChFrame<double> local_198;
  shared_ptr<chrono::viper::ViperWheel> local_110 [2];
  ChVector<double> local_f0;
  ChFrame<double> local_d8;
  shared_ptr<chrono::viper::ViperWheel> local_50;
  double local_40;
  double wz;
  double wy;
  double wx;
  ViperWheelType local_14;
  Viper *pVStack_10;
  ViperWheelType wheel_type_local;
  Viper *this_local;
  
  local_14 = wheel_type;
  pVStack_10 = this;
  chrono_types::
  make_shared<chrono::viper::ViperChassis,_const_char_(&)[8],_std::shared_ptr<chrono::ChMaterialSurface>_&,_0>
            ((char (*) [8])&wx,(shared_ptr<chrono::ChMaterialSurface> *)0x2a378c);
  std::shared_ptr<chrono::viper::ViperChassis>::operator=
            (&this->m_chassis,(shared_ptr<chrono::viper::ViperChassis> *)&wx);
  std::shared_ptr<chrono::viper::ViperChassis>::~shared_ptr
            ((shared_ptr<chrono::viper::ViperChassis> *)&wx);
  wy = 0.6417999999999999;
  wz = 0.6097999999999999;
  local_40 = 0.0;
  ChVector<double>::ChVector(&local_f0,0.6417999999999999,0.6097999999999999,0.0);
  ChFrame<double>::ChFrame(&local_d8,&local_f0,(ChQuaternion<double> *)&QUNIT);
  chrono_types::
  make_shared<chrono::viper::ViperWheel,_const_char_(&)[9],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::viper::ViperWheelType_&,_0>
            ((char (*) [9])&local_50,(ChFrame<double> *)"wheel_LF",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_d8,
             (ViperWheelType *)&this->m_wheel_material);
  pvVar1 = std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::operator[]
                     (&this->m_wheels,0);
  std::shared_ptr<chrono::viper::ViperWheel>::operator=(pvVar1,&local_50);
  std::shared_ptr<chrono::viper::ViperWheel>::~shared_ptr(&local_50);
  ChFrame<double>::~ChFrame(&local_d8);
  ChVector<double>::ChVector(&local_1b0,wy,-wz,local_40);
  ChFrame<double>::ChFrame(&local_198,&local_1b0,(ChQuaternion<double> *)&QUNIT);
  chrono_types::
  make_shared<chrono::viper::ViperWheel,_const_char_(&)[9],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::viper::ViperWheelType_&,_0>
            ((char (*) [9])local_110,(ChFrame<double> *)"wheel_RF",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_198,
             (ViperWheelType *)&this->m_wheel_material);
  pvVar1 = std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::operator[]
                     (&this->m_wheels,1);
  std::shared_ptr<chrono::viper::ViperWheel>::operator=(pvVar1,local_110);
  std::shared_ptr<chrono::viper::ViperWheel>::~shared_ptr(local_110);
  ChFrame<double>::~ChFrame(&local_198);
  ChVector<double>::ChVector(&local_260,-wy,wz,local_40);
  ChFrame<double>::ChFrame(&local_248,&local_260,(ChQuaternion<double> *)&QUNIT);
  chrono_types::
  make_shared<chrono::viper::ViperWheel,_const_char_(&)[9],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::viper::ViperWheelType_&,_0>
            ((char (*) [9])&local_1c0,(ChFrame<double> *)"wheel_LB",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_248,
             (ViperWheelType *)&this->m_wheel_material);
  pvVar1 = std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::operator[]
                     (&this->m_wheels,2);
  std::shared_ptr<chrono::viper::ViperWheel>::operator=(pvVar1,&local_1c0);
  std::shared_ptr<chrono::viper::ViperWheel>::~shared_ptr(&local_1c0);
  ChFrame<double>::~ChFrame(&local_248);
  ChVector<double>::ChVector(&local_310,-wy,-wz,local_40);
  ChFrame<double>::ChFrame(&local_2f8,&local_310,(ChQuaternion<double> *)&QUNIT);
  chrono_types::
  make_shared<chrono::viper::ViperWheel,_const_char_(&)[9],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::viper::ViperWheelType_&,_0>
            ((char (*) [9])&local_270,(ChFrame<double> *)"wheel_RB",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_2f8,
             (ViperWheelType *)&this->m_wheel_material);
  pvVar1 = std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::operator[]
                     (&this->m_wheels,3);
  std::shared_ptr<chrono::viper::ViperWheel>::operator=(pvVar1,&local_270);
  std::shared_ptr<chrono::viper::ViperWheel>::~shared_ptr(&local_270);
  ChFrame<double>::~ChFrame(&local_2f8);
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_398,(ChVector<double> *)&VNULL,&local_3b8);
  p_Var2 = (__shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::operator[]
                        (&this->m_wheels,0);
  peVar3 = std::
           __shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var2);
  ChFrame<double>::operator=(&(peVar3->super_ViperPart).m_mesh_xform,&local_398);
  ChFrame<double>::~ChFrame(&local_398);
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_440,(ChVector<double> *)&VNULL,(ChQuaternion<double> *)&cr_lx);
  p_Var2 = (__shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::operator[]
                        (&this->m_wheels,2);
  peVar3 = std::
           __shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var2);
  ChFrame<double>::operator=(&(peVar3->super_ViperPart).m_mesh_xform,&local_440);
  ChFrame<double>::~ChFrame(&local_440);
  cr_rel_pos_lower[3].m_data[2] = 0.0525;
  ChVector<double>::ChVector
            ((ChVector<double> *)(cr_rel_pos_upper[3].m_data + 2),0.6417999999999999,0.2067,-0.0525)
  ;
  ChVector<double>::ChVector
            ((ChVector<double> *)(cr_rel_pos_lower[0].m_data + 2),0.6417999999999999,-0.2067,
             -cr_rel_pos_lower[3].m_data[2]);
  ChVector<double>::ChVector
            ((ChVector<double> *)(cr_rel_pos_lower[1].m_data + 2),-0.6417999999999999,0.2067,
             -cr_rel_pos_lower[3].m_data[2]);
  ChVector<double>::ChVector
            ((ChVector<double> *)(cr_rel_pos_lower[2].m_data + 2),-0.6417999999999999,-0.2067,
             -cr_rel_pos_lower[3].m_data[2]);
  ChVector<double>::ChVector
            ((ChVector<double> *)local_538,0.6417999999999999,0.2067,cr_rel_pos_lower[3].m_data[2]);
  ChVector<double>::ChVector
            ((ChVector<double> *)(cr_rel_pos_upper[0].m_data + 2),0.6417999999999999,-0.2067,
             cr_rel_pos_lower[3].m_data[2]);
  ChVector<double>::ChVector
            ((ChVector<double> *)(cr_rel_pos_upper[1].m_data + 2),-0.6417999999999999,0.2067,
             cr_rel_pos_lower[3].m_data[2]);
  ChVector<double>::ChVector
            ((ChVector<double> *)(cr_rel_pos_upper[2].m_data + 2),-0.6417999999999999,-0.2067,
             cr_rel_pos_lower[3].m_data[2]);
  for (local_53c = 0; local_53c < 4; local_53c = local_53c + 1) {
    ChFrame<double>::ChFrame
              (&local_5d8,(ChVector<double> *)(cr_rel_pos_upper[(long)local_53c + 3].m_data + 2),
               (ChQuaternion<double> *)&QUNIT);
    local_5dc = local_53c % 2;
    chrono_types::
    make_shared<chrono::viper::ViperLowerArm,_const_char_(&)[10],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
              ((char (*) [10])&local_550,(ChFrame<double> *)"lower_arm",
               (shared_ptr<chrono::ChMaterialSurface> *)&local_5d8,(int *)&this->m_default_material)
    ;
    this_00 = std::array<std::shared_ptr<chrono::viper::ViperLowerArm>,_4UL>::operator[]
                        (&this->m_lower_arms,(long)local_53c);
    std::shared_ptr<chrono::viper::ViperLowerArm>::operator=(this_00,&local_550);
    std::shared_ptr<chrono::viper::ViperLowerArm>::~shared_ptr(&local_550);
    ChFrame<double>::~ChFrame(&local_5d8);
    ChFrame<double>::ChFrame
              (&local_678,(ChVector<double> *)(local_538 + (long)local_53c * 0x18),
               (ChQuaternion<double> *)&QUNIT);
    chrono_types::
    make_shared<chrono::viper::ViperUpperArm,_const_char_(&)[10],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
              ((char (*) [10])&local_5f0,(ChFrame<double> *)"upper_arm",
               (shared_ptr<chrono::ChMaterialSurface> *)&local_678,(int *)&this->m_default_material)
    ;
    this_01 = std::array<std::shared_ptr<chrono::viper::ViperUpperArm>,_4UL>::operator[]
                        (&this->m_upper_arms,(long)local_53c);
    std::shared_ptr<chrono::viper::ViperUpperArm>::operator=(this_01,&local_5f0);
    std::shared_ptr<chrono::viper::ViperUpperArm>::~shared_ptr(&local_5f0);
    ChFrame<double>::~ChFrame(&local_678);
  }
  sr_rel_pos[3].m_data[2] = 0.0;
  ChVector<double>::ChVector
            ((ChVector<double> *)local_6f8,0.6417999999999999,0.6097999999999999,-0.0);
  ChVector<double>::ChVector
            ((ChVector<double> *)(sr_rel_pos[0].m_data + 2),0.6417999999999999,-0.6097999999999999,
             -sr_rel_pos[3].m_data[2]);
  ChVector<double>::ChVector
            ((ChVector<double> *)(sr_rel_pos[1].m_data + 2),-0.6417999999999999,0.6097999999999999,
             -sr_rel_pos[3].m_data[2]);
  ChVector<double>::ChVector
            ((ChVector<double> *)(sr_rel_pos[2].m_data + 2),-0.6417999999999999,-0.6097999999999999,
             -sr_rel_pos[3].m_data[2]);
  for (local_6fc = 0; local_6fc < 4; local_6fc = local_6fc + 1) {
    ChFrame<double>::ChFrame
              ((ChFrame<double> *)&i_2,(ChVector<double> *)(local_6f8 + (long)local_6fc * 0x18),
               (ChQuaternion<double> *)&QUNIT);
    local_79c = local_6fc % 2;
    chrono_types::
    make_shared<chrono::viper::ViperUpright,_const_char_(&)[8],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
              ((char (*) [8])&local_710,(ChFrame<double> *)"upright",
               (shared_ptr<chrono::ChMaterialSurface> *)&i_2,(int *)&this->m_default_material);
    this_02 = std::array<std::shared_ptr<chrono::viper::ViperUpright>,_4UL>::operator[]
                        (&this->m_uprights,(long)local_6fc);
    std::shared_ptr<chrono::viper::ViperUpright>::operator=(this_02,&local_710);
    std::shared_ptr<chrono::viper::ViperUpright>::~shared_ptr(&local_710);
    ChFrame<double>::~ChFrame((ChFrame<double> *)&i_2);
  }
  for (local_7a0 = 0; local_7a0 < 4; local_7a0 = local_7a0 + 1) {
    chrono_types::make_shared<chrono::ChShaft,_0>();
    this_03 = std::array<std::shared_ptr<chrono::ChShaft>,_4UL>::operator[]
                        (&this->m_drive_shafts,(long)local_7a0);
    std::shared_ptr<chrono::ChShaft>::operator=(this_03,&local_7b0);
    std::shared_ptr<chrono::ChShaft>::~shared_ptr(&local_7b0);
  }
  return;
}

Assistant:

void Viper::Create(ViperWheelType wheel_type) {
    // create rover chassis
    m_chassis = chrono_types::make_shared<ViperChassis>("chassis", m_default_material);

    // initilize rover wheels
    double wx = 0.5618 + 0.08;
    double wy = 0.2067 + 0.32 + 0.0831;
    double wz = 0.0;

    m_wheels[V_LF] = chrono_types::make_shared<ViperWheel>("wheel_LF", ChFrame<>(ChVector<>(+wx, +wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_RF] = chrono_types::make_shared<ViperWheel>("wheel_RF", ChFrame<>(ChVector<>(+wx, -wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_LB] = chrono_types::make_shared<ViperWheel>("wheel_LB", ChFrame<>(ChVector<>(-wx, +wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_RB] = chrono_types::make_shared<ViperWheel>("wheel_RB", ChFrame<>(ChVector<>(-wx, -wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);

    m_wheels[V_LF]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[V_LB]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));

    // create rover upper and lower suspension arms
    double cr_lx = 0.5618 + 0.08;
    double cr_ly = 0.2067;  // + 0.32/2;
    double cr_lz = 0.0525;

    ChVector<> cr_rel_pos_lower[] = {
        ChVector<>(+cr_lx, +cr_ly, -cr_lz),  // LF
        ChVector<>(+cr_lx, -cr_ly, -cr_lz),  // RF
        ChVector<>(-cr_lx, +cr_ly, -cr_lz),  // LB
        ChVector<>(-cr_lx, -cr_ly, -cr_lz)   // RB
    };

    ChVector<> cr_rel_pos_upper[] = {
        ChVector<>(+cr_lx, +cr_ly, cr_lz),  // LF
        ChVector<>(+cr_lx, -cr_ly, cr_lz),  // RF
        ChVector<>(-cr_lx, +cr_ly, cr_lz),  // LB
        ChVector<>(-cr_lx, -cr_ly, cr_lz)   // RB
    };

    for (int i = 0; i < 4; i++) {
        m_lower_arms[i] = chrono_types::make_shared<ViperLowerArm>("lower_arm", ChFrame<>(cr_rel_pos_lower[i], QUNIT),
                                                                   m_default_material, i % 2);
        m_upper_arms[i] = chrono_types::make_shared<ViperUpperArm>("upper_arm", ChFrame<>(cr_rel_pos_upper[i], QUNIT),
                                                                   m_default_material, i % 2);
    }

    // create uprights
    double sr_lx = 0.5618 + 0.08;
    double sr_ly = 0.2067 + 0.32 + 0.0831;
    double sr_lz = 0.0;
    ChVector<> sr_rel_pos[] = {
        ChVector<>(+sr_lx, +sr_ly, -sr_lz),  // LF
        ChVector<>(+sr_lx, -sr_ly, -sr_lz),  // RF
        ChVector<>(-sr_lx, +sr_ly, -sr_lz),  // LB
        ChVector<>(-sr_lx, -sr_ly, -sr_lz)   // RB
    };

    for (int i = 0; i < 4; i++) {
        m_uprights[i] = chrono_types::make_shared<ViperUpright>("upright", ChFrame<>(sr_rel_pos[i], QUNIT),
                                                                m_default_material, i % 2);
    }

    // create drive shafts
    for (int i = 0; i < 4; i++) {
        m_drive_shafts[i] = chrono_types::make_shared<ChShaft>();
    }
}